

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_response.hpp
# Opt level: O2

void __thiscall
cinatra::coro_http_response::redirect(coro_http_response *this,string *url,bool is_forever)

{
  string *this_00;
  allocator<char> local_79;
  string local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&local_38,url);
  add_header<char_const*,std::__cxx11::string>(this,"Location",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (is_forever) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
    set_status_and_content
              (this,moved_permanently,&local_78,none,(string_view)(ZEXT816(0x26d00e) << 0x40));
    this_00 = &local_78;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_79);
    set_status_and_content
              (this,moved_temporarily,&local_58,none,(string_view)(ZEXT816(0x26d00e) << 0x40));
    this_00 = &local_58;
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void redirect(const std::string &url, bool is_forever = false) {
    add_header("Location", url);
    is_forever == false
        ? set_status_and_content(status_type::moved_temporarily, "")
        : set_status_and_content(status_type::moved_permanently, "");
  }